

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_RevSurface::Trim(ON_RevSurface *this,int dir,ON_Interval *domain)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  double dVar4;
  ON_BoundingBox local_c8;
  undefined1 local_98 [8];
  ON_BoundingBox bbox0;
  double d;
  ON_Interval a;
  double t1;
  double t0;
  ON_Interval dom;
  bool rc;
  ON_Interval *domain_local;
  int dir_local;
  ON_RevSurface *this_local;
  
  dom.m_t[1]._7_1_ = 0;
  if ((dir == 0) || (dir == 1)) {
    bVar1 = ON_Interval::IsIncreasing(domain);
    if (bVar1) {
      domain_local._4_4_ = dir;
      if ((this->m_bTransposed & 1U) != 0) {
        domain_local._4_4_ = 1 - dir;
      }
      if (domain_local._4_4_ == 0) {
        ON_Interval::ON_Interval((ON_Interval *)&t0);
        ON_Interval::Intersection((ON_Interval *)&t0,domain,&this->m_t);
        bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&t0);
        if (((!bVar1) || (bVar1 = ON_Interval::IsIncreasing(&this->m_t), !bVar1)) ||
           (bVar1 = ON_Interval::IsIncreasing(&this->m_angle), !bVar1)) {
          return false;
        }
        pdVar3 = ON_Interval::operator[]((ON_Interval *)&t0,0);
        dVar4 = ON_Interval::NormalizedParameterAt(&this->m_t,*pdVar3);
        pdVar3 = ON_Interval::operator[]((ON_Interval *)&t0,1);
        a.m_t[1] = ON_Interval::NormalizedParameterAt(&this->m_t,*pdVar3);
        ON_Interval::ON_Interval((ON_Interval *)&d);
        dVar4 = ON_Interval::ParameterAt(&this->m_angle,dVar4);
        pdVar3 = ON_Interval::operator[]((ON_Interval *)&d,0);
        *pdVar3 = dVar4;
        dVar4 = ON_Interval::ParameterAt(&this->m_angle,a.m_t[1]);
        pdVar3 = ON_Interval::operator[]((ON_Interval *)&d,1);
        *pdVar3 = dVar4;
        bbox0.m_max.z = ON_Interval::Length((ON_Interval *)&d);
        if ((2.3283064365386963e-10 < ABS(bbox0.m_max.z)) &&
           (ABS(bbox0.m_max.z) <= 6.283185307412417)) {
          (this->m_angle).m_t[0] = d;
          (this->m_angle).m_t[1] = a.m_t[0];
          (this->m_t).m_t[0] = domain->m_t[0];
          (this->m_t).m_t[1] = domain->m_t[1];
          dom.m_t[1]._7_1_ = 1;
        }
      }
      else if ((domain_local._4_4_ == 1) && (this->m_curve != (ON_Curve *)0x0)) {
        iVar2 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3c])
                          (this->m_curve,domain);
        dom.m_t[1]._7_1_ = (byte)iVar2 & 1;
      }
      if ((dom.m_t[1]._7_1_ & 1) != 0) {
        memcpy(local_98,&this->m_bbox,0x30);
        ON_BoundingBox::Destroy(&this->m_bbox);
        ON_Geometry::BoundingBox(&local_c8,(ON_Geometry *)this);
        bVar1 = ON_BoundingBox::IsValid(&this->m_bbox);
        if ((bVar1) && (bVar1 = ON_BoundingBox::IsValid((ON_BoundingBox *)local_98), bVar1)) {
          ON_BoundingBox::Intersection(&this->m_bbox,(ON_BoundingBox *)local_98);
        }
      }
      this_local._7_1_ = (bool)(dom.m_t[1]._7_1_ & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RevSurface::Trim( int dir, const ON_Interval& domain )
{
  bool rc = false;
  if ( dir != 0 && dir != 1 )
    return false;
  if ( !domain.IsIncreasing() )
    return false;
  if ( m_bTransposed )
    dir = 1-dir;
  if ( dir == 0 )
  {
    ON_Interval dom;
    dom.Intersection(domain,m_t);
    if ( !dom.IsIncreasing() || !m_t.IsIncreasing() || !m_angle.IsIncreasing() )
      return false;
    double t0 = m_t.NormalizedParameterAt(dom[0]);
    double t1 = m_t.NormalizedParameterAt(dom[1]);
    ON_Interval a;
    a[0] = m_angle.ParameterAt(t0);
    a[1] = m_angle.ParameterAt(t1);
    double d = a.Length();
    if ( fabs(d) > ON_ZERO_TOLERANCE && fabs(d) <= 2.0*ON_PI+ON_ZERO_TOLERANCE )
    {
      m_angle = a;
      m_t = domain;
      rc = true;
    }
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->Trim( domain );
  }
  if ( rc )
  {
    // update bounding box
    ON_BoundingBox bbox0 = m_bbox;
    m_bbox.Destroy();
    BoundingBox();
    if ( m_bbox.IsValid() && bbox0.IsValid() )
      m_bbox.Intersection(bbox0);
  }
  return rc;
}